

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

doorindex_t * get_nearest_door(tgestate_t *state)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  char cVar4;
  doorindex_t *pdVar5;
  doorindex_t *pdVar6;
  byte bVar7;
  long lVar8;
  
  if (state->room_index == '\0') {
    pdVar5 = state->locked_doors;
    lVar8 = 0x775;
    do {
      uVar3 = (ulong)(byte)(*(char *)((long)state->jmpbuf_main[0].__jmpbuf + lVar8 + -0x20) * '\x02'
                           );
      iVar2 = door_in_range(state,doors + uVar3);
      if (iVar2 == 0) {
        return pdVar5;
      }
      iVar2 = door_in_range(state,doors + uVar3 + 1);
      if (iVar2 == 0) {
        return (doorindex_t *)((long)state->jmpbuf_main[0].__jmpbuf + lVar8 + -0x20);
      }
      pdVar5 = pdVar5 + 1;
      lVar8 = lVar8 + 1;
    } while ((char)lVar8 != 'z');
  }
  else {
    pdVar5 = state->locked_doors + 2;
    cVar4 = '\b';
    do {
      if (state->interior_doors[0] != 0xff) {
        bVar7 = state->interior_doors[0];
        pdVar6 = state->interior_doors;
        do {
          pdVar6 = pdVar6 + 1;
          if (((bVar7 ^ *pdVar5) & 0x7f) == 0) {
            lVar8 = (ulong)(bVar7 & 0x7f) * 8;
            uVar3 = (ulong)(bVar7 >> 5 & 4);
            uVar1 = (state->saved_mappos).pos16.u;
            bVar7 = *(byte *)(uVar3 + lVar8 + 0x10eda1);
            if ((uVar1 <= (ushort)(bVar7 + 3) && (int)(bVar7 - 3) < (int)(uint)uVar1) &&
               (uVar1 = (state->saved_mappos).pos16.v, bVar7 = *(byte *)(lVar8 + 0x10eda2 + uVar3),
               uVar1 <= (ushort)(bVar7 + 3) && (int)(bVar7 - 3) < (int)(uint)uVar1)) {
              return pdVar5;
            }
            break;
          }
          bVar7 = *pdVar6;
        } while (bVar7 != 0xff);
      }
      pdVar5 = pdVar5 + 1;
      cVar4 = cVar4 + -1;
    } while (cVar4 != '\0');
  }
  return (doorindex_t *)0x0;
}

Assistant:

doorindex_t *get_nearest_door(tgestate_t *state)
{
  doorindex_t  *locked_doors;         /* was HL */
  uint8_t       iters;                /* was B */
  const door_t *door;                 /* was HL' */
  doorindex_t   locked_door_index;    /* was C */
  doorindex_t  *interior_doors;       /* was DE */
  mappos16_t   *mappos;               /* was DE' */
  doorindex_t   interior_door_index;  /* was A */

  assert(state != NULL);

  if (state->room_index == room_0_OUTDOORS)
  {
    /* Outdoors. */

    /* Locked doors 0..4 include exterior doors. */
    locked_doors = &state->locked_doors[0];
    iters = 5;
    do
    {
      door = get_door(*locked_doors & ~door_LOCKED); // Conv: A used as temporary.
      if (door_in_range(state, door + 0) == 0 ||
          door_in_range(state, door + 1) == 0)
        return locked_doors; /* Conv: goto removed. */

      locked_doors++;
    }
    while (--iters);

    return NULL; /* Not found */
  }
  else
  {
    /* Indoors. */

    /* Locked doors 2..8 include interior doors. */
    locked_doors = &state->locked_doors[2];
    iters = 8; // BUG: iters should be 7
    do
    {
      locked_door_index = *locked_doors & ~door_LOCKED;

      /* Search interior_doors[] for door_index. */
      for (interior_doors = &state->interior_doors[0]; ; interior_doors++)
      {
        interior_door_index = *interior_doors;
        if (interior_door_index == interiordoor_NONE)
          break; /* end of list */

        if ((interior_door_index & ~door_REVERSE) == locked_door_index) // this must be door_REVERSE as it came from interior_doors[]
          goto found;

        /* There's no termination condition here where you might expect a
         * test to see if we've run out of doors, but since every room has
         * at least one door it *must* find one. */
      }

next_locked_door:
      locked_doors++;
    }
    while (--iters);

    return NULL; /* Not found */


    // FUTURE: Move this into the body of the loop.
found:
    door = get_door(*interior_doors);
    /* Range check pattern (-2..+3). */
    mappos = &state->saved_mappos.pos16; // note: 16-bit values holding 8-bit values
    // Conv: Unrolled.
    if (mappos->u <= door->mappos.u - 3 || mappos->u > door->mappos.u + 3 ||
        mappos->v <= door->mappos.v - 3 || mappos->v > door->mappos.v + 3)
      goto next_locked_door;

    return locked_doors;
  }
}